

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall datarate_test::anon_unknown_0::DatarateTestSVC::ResetModel(DatarateTestSVC *this)

{
  long in_RDI;
  int i_1;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  DatarateTest::ResetModel((DatarateTest *)(in_RDI + 0x18));
  *(undefined4 *)(in_RDI + 0x4e8) = 0;
  *(undefined4 *)(in_RDI + 0x4ec) = 0;
  *(undefined4 *)(in_RDI + 0x4f0) = 1;
  *(undefined4 *)(in_RDI + 0x4f4) = 1;
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 0x4f8 + (long)local_c * 4) = 0;
    *(undefined8 *)(in_RDI + 0x7b0 + (long)local_c * 8) = 0;
  }
  memset((void *)(in_RDI + 0x7a4),0,8);
  memset((void *)(in_RDI + 0x578),0,0x1c8);
  memset((void *)(in_RDI + 0x740),0,0x58);
  memset((void *)(in_RDI + 0x798),0,0xc);
  *(undefined4 *)(in_RDI + 0x8b0) = 0;
  for (local_10 = 0; local_10 < 1000; local_10 = local_10 + 1) {
    *(undefined4 *)(in_RDI + 0x8b4 + (long)local_10 * 4) = 1000;
  }
  *(undefined4 *)(in_RDI + 0x1858) = 0;
  *(undefined4 *)(in_RDI + 0x1854) = 0;
  *(undefined8 *)(in_RDI + 0x1860) = 0;
  *(undefined4 *)(in_RDI + 0x1868) = 0;
  *(undefined4 *)(in_RDI + 0x186c) = 0;
  *(undefined4 *)(in_RDI + 0x1870) = 0;
  *(undefined4 *)(in_RDI + 0x1874) = 0;
  *(undefined4 *)(in_RDI + 0x1878) = 0;
  *(undefined4 *)(in_RDI + 0x187c) = 0;
  *(undefined4 *)(in_RDI + 0x1880) = 0;
  *(undefined4 *)(in_RDI + 0x1884) = 0;
  *(undefined4 *)(in_RDI + 0x1888) = 0;
  *(undefined4 *)(in_RDI + 0x188c) = 0;
  *(undefined4 *)(in_RDI + 0x1890) = 0;
  *(undefined4 *)(in_RDI + 0x1894) = 0;
  *(undefined4 *)(in_RDI + 0x1898) = 0;
  *(undefined4 *)(in_RDI + 0x189c) = 0;
  *(undefined4 *)(in_RDI + 0x18a8) = 0;
  *(undefined1 *)(in_RDI + 0x18b4) = 0;
  *(undefined4 *)(in_RDI + 0x18a0) = 0;
  *(undefined1 *)(in_RDI + 0x18a4) = 0;
  *(undefined1 *)(in_RDI + 0x18a5) = 0;
  *(undefined1 *)(in_RDI + 0x18bc) = 0;
  *(undefined4 *)(in_RDI + 0x18e4) = 0;
  *(undefined1 *)(in_RDI + 0x18e8) = 0;
  return;
}

Assistant:

void ResetModel() override {
    DatarateTest::ResetModel();
    layer_frame_cnt_ = 0;
    superframe_cnt_ = 0;
    number_temporal_layers_ = 1;
    number_spatial_layers_ = 1;
    for (int i = 0; i < AOM_MAX_LAYERS; i++) {
      target_layer_bitrate_[i] = 0;
      effective_datarate_tl[i] = 0.0;
    }
    memset(&layer_id_, 0, sizeof(aom_svc_layer_id_t));
    memset(&svc_params_, 0, sizeof(aom_svc_params_t));
    memset(&ref_frame_config_, 0, sizeof(aom_svc_ref_frame_config_t));
    memset(&ref_frame_comp_pred_, 0, sizeof(aom_svc_ref_frame_comp_pred_t));
    drop_frames_ = 0;
    for (int i = 0; i < 1000; i++) drop_frames_list_[i] = 1000;
    decoded_nframes_ = 0;
    mismatch_nframes_ = 0;
    mismatch_psnr_ = 0.0;
    set_frame_level_er_ = 0;
    multi_ref_ = 0;
    use_fixed_mode_svc_ = 0;
    comp_pred_ = 0;
    dynamic_enable_disable_mode_ = 0;
    intra_only_ = 0;
    intra_only_single_layer_ = false;
    frame_to_start_decoding_ = 0;
    layer_to_decode_ = 0;
    frame_sync_ = 0;
    current_video_frame_ = 0;
    screen_mode_ = 0;
    rps_mode_ = 0;
    rps_recovery_frame_ = 0;
    user_define_frame_qp_ = 0;
    set_speed_per_layer_ = false;
    simulcast_mode_ = false;
    use_last_as_scaled_ = false;
    use_last_as_scaled_single_ref_ = false;
    external_resize_dynamic_drop_layer_ = false;
    external_resize_pattern_ = 0;
    dynamic_tl_ = false;
  }